

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O0

arm64_reg AArch64_map_insn(char *name)

{
  name_map *in_RDI;
  int i;
  char *in_stack_ffffffffffffffe8;
  undefined4 local_10;
  int in_stack_fffffffffffffff4;
  
  local_10 = name2id(in_RDI,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8);
  if (local_10 == ~ARM64_REG_INVALID) {
    local_10 = name2id(in_RDI,-1,in_stack_ffffffffffffffe8);
  }
  if (local_10 == ~ARM64_REG_INVALID) {
    local_10 = ARM64_REG_INVALID;
  }
  return local_10;
}

Assistant:

arm64_reg AArch64_map_insn(const char *name)
{
	// NOTE: skip first NULL name in insn_name_maps
	int i = name2id(&insn_name_maps[1], ARR_SIZE(insn_name_maps) - 1, name);

	if (i == -1)
		// try again with 'special' insn that is not available in insn_name_maps
		i = name2id(alias_insn_name_maps, ARR_SIZE(alias_insn_name_maps), name);

	return (i != -1)? i : ARM64_REG_INVALID;
}